

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lambertian.h
# Opt level: O2

RGBColor __thiscall
pm::Lambertian::sampleF(Lambertian *this,ShadeRecord *sr,Vector3 *wo,Vector3 *wi,float *pdf)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  float *in_R9;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  RGBColor RVar11;
  Vector3 sp;
  unsigned_long local_40;
  float local_38;
  
  fVar5 = wo[4].x;
  uVar1 = wo[3].y;
  uVar3 = wo[3].z;
  fVar10 = fVar5 - (float)uVar3 * 0.0071;
  fVar8 = (float)uVar1 * 0.0071 + fVar5 * -0.0034;
  fVar9 = (float)uVar3 * 0.0034 - (float)uVar1;
  fVar7 = SQRT(fVar9 * fVar9 + fVar10 * fVar10 + fVar8 * fVar8);
  fVar10 = fVar10 / fVar7;
  fVar8 = fVar8 / fVar7;
  fVar9 = fVar9 / fVar7;
  SamplerState::sampleHemisphere((SamplerState *)&stack0xffffffffffffffc0);
  fVar7 = (float)local_40;
  fVar6 = (float)(local_40 >> 0x20);
  *(ulong *)pdf =
       CONCAT44(local_38 * (float)uVar3 +
                fVar8 * fVar6 + (fVar9 * (float)uVar1 - fVar5 * fVar10) * fVar7,
                local_38 * (float)uVar1 +
                (fVar8 * fVar5 - (float)uVar3 * fVar9) * fVar7 + fVar10 * fVar6);
  pdf[2] = fVar5 * local_38 + fVar6 * fVar9 + (fVar10 * (float)uVar3 - (float)uVar1 * fVar8) * fVar7
  ;
  Vector3::normalize((Vector3 *)pdf);
  fVar5 = dot((Vector3 *)&wo[3].y,(Vector3 *)pdf);
  *in_R9 = fVar5 * 0.31830987;
  uVar2 = (sr->localHitPoint).y;
  uVar4 = (sr->localHitPoint).z;
  RVar11.r = (float)uVar2 * (sr->normal).y * 0.31830987;
  RVar11.g = (float)uVar4;
  (this->super_BRDF)._vptr_BRDF =
       (_func_int **)
       CONCAT44((sr->normal).x * (float)uVar2 * 0.31830987,(float)uVar2 * (float)uVar4 * 0.31830987)
  ;
  *(float *)&(this->super_BRDF).samplerState_.count_ = RVar11.r;
  RVar11.b = 0.31830987;
  return RVar11;
}

Assistant:

inline RGBColor Lambertian::sampleF(const ShadeRecord &sr, const Vector3 &wo, Vector3 &wi, float &pdf) const
{
	const Vector3 w = sr.normal;
	// jitter the up vector in case normal is vertical
	Vector3 v = cross(Vector3(0.0034f, 1.0f, 0.0071f), w);
	v.normalize();
	const Vector3 u = cross(v, w);

	const Vector3 sp = samplerState_.sampleHemisphere();
	wi = sp.x * u + sp.y * v + sp.z * w;
	wi.normalize();

	pdf = dot(sr.normal, wi) * invPi;

	return (kd_ * cd_ * invPi);
}